

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

aiNodeAnim * CreateNodeAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  Sampler *pSVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  aiNodeAnim *paVar6;
  aiVectorKey *paVar7;
  aiQuatKey *paVar8;
  float *pfVar9;
  ulong uVar10;
  aiQuatKey *paVar11;
  uint uVar12;
  ulong uVar13;
  aiNodeAnim *paVar14;
  long lVar15;
  aiVector3D *values;
  float *times;
  aiQuaterniont<float> *local_60;
  aiNodeAnim *local_58;
  float *local_50;
  ulong local_48;
  float local_40 [4];
  
  paVar6 = (aiNodeAnim *)operator_new(0x438);
  (paVar6->mNodeName).length = 0;
  (paVar6->mNodeName).data[0] = '\0';
  local_58 = paVar6;
  memset((paVar6->mNodeName).data + 1,0x1b,0x3ff);
  paVar6->mRotationKeys = (aiQuatKey *)0x0;
  paVar6->mNumScalingKeys = 0;
  *(undefined8 *)&paVar6->mNumPositionKeys = 0;
  *(undefined8 *)((long)&paVar6->mPositionKeys + 4) = 0;
  paVar6->mScalingKeys = (aiVectorKey *)0x0;
  paVar6->mPreState = aiAnimBehaviour_DEFAULT;
  paVar6->mPostState = aiAnimBehaviour_DEFAULT;
  uVar13 = (ulong)((node->super_Object).name._M_string_length != 0);
  local_50 = local_40;
  lVar15 = *(long *)((node->matrix).value + uVar13 * 8 + -0x1c);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar15,
             *(long *)((node->matrix).value + uVar13 * 8 + -0x1a) + lVar15);
  pfVar9 = local_50;
  paVar14 = local_58;
  if (local_48 < 0x400) {
    (local_58->mNodeName).length = (ai_uint32)local_48;
    memcpy((paVar6->mNodeName).data,local_50,local_48);
    (paVar14->mNodeName).data[local_48] = '\0';
  }
  if (pfVar9 != local_40) {
    operator_delete(pfVar9);
  }
  paVar14 = local_58;
  pSVar2 = samplers->translation;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->translation).isPresent == true) {
      local_58->mNumPositionKeys = 1;
      paVar7 = (aiVectorKey *)operator_new(0x18);
      paVar14->mPositionKeys = paVar7;
      paVar7->mTime = 0.0;
      fVar3 = (node->translation).value[1];
      (paVar7->mValue).x = (node->translation).value[0];
      (paVar7->mValue).y = fVar3;
      (paVar7->mValue).z = (node->translation).value[2];
    }
  }
  else {
    local_50 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              (*(Accessor **)
                ((long)(((pSVar2->input).vector)->
                       super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + (ulong)(pSVar2->input).index * 8),
               &local_50);
    local_60 = (aiQuaterniont<float> *)0x0;
    glTF2::Accessor::ExtractData<aiVector3t<float>>
              ((((samplers->translation->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->translation->output).index],
               (aiVector3t<float> **)&local_60);
    uVar13 = *(ulong *)(*(long *)((long)(((samplers->translation->input).vector)->
                                        super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start +
                                 (ulong)(samplers->translation->input).index * 8) + 0x70);
    uVar12 = (uint)uVar13;
    uVar13 = uVar13 & 0xffffffff;
    paVar6->mNumPositionKeys = uVar12;
    paVar7 = (aiVectorKey *)operator_new__(uVar13 * 0x18);
    if (uVar13 != 0) {
      uVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&paVar7->mTime + uVar10);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&(paVar7->mValue).z + uVar10) = 0;
        uVar10 = uVar10 + 0x18;
      } while (uVar13 * 0x18 != uVar10);
    }
    local_58->mPositionKeys = paVar7;
    if (uVar12 == 0) {
      if (local_50 != (float *)0x0) goto LAB_0065f239;
    }
    else {
      lVar15 = 0;
      pfVar9 = local_50;
      do {
        *(double *)((long)&paVar7->mTime + lVar15 * 2) = (double)(*pfVar9 * 1000.0);
        *(undefined8 *)((long)&(paVar7->mValue).x + lVar15 * 2) =
             *(undefined8 *)((long)&local_60->w + lVar15);
        *(undefined4 *)((long)&(paVar7->mValue).z + lVar15 * 2) =
             *(undefined4 *)((long)&local_60->y + lVar15);
        pfVar9 = pfVar9 + 1;
        lVar15 = lVar15 + 0xc;
      } while (uVar13 * 0xc != lVar15);
LAB_0065f239:
      operator_delete__(local_50);
    }
    paVar14 = local_58;
    if (local_60 != (aiQuaterniont<float> *)0x0) {
      operator_delete__(local_60);
    }
  }
  pSVar2 = samplers->rotation;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->rotation).isPresent == true) {
      paVar14->mNumRotationKeys = 1;
      paVar8 = (aiQuatKey *)operator_new__(0x18);
      paVar14->mRotationKeys = paVar8;
      paVar8->mTime = 0.0;
      fVar3 = (node->rotation).value[0];
      fVar4 = (node->rotation).value[1];
      fVar5 = (node->rotation).value[2];
      (paVar8->mValue).w = (node->rotation).value[3];
      (paVar8->mValue).x = fVar3;
      (paVar8->mValue).y = fVar4;
      (paVar8->mValue).z = fVar5;
    }
  }
  else {
    local_50 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&local_50);
    local_60 = (aiQuaterniont<float> *)0x0;
    glTF2::Accessor::ExtractData<aiQuaterniont<float>>
              ((((samplers->rotation->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->rotation->output).index],&local_60);
    uVar13 = (((samplers->rotation->input).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(samplers->rotation->input).index]->count;
    uVar12 = (uint)uVar13;
    uVar13 = uVar13 & 0xffffffff;
    paVar14->mNumRotationKeys = uVar12;
    paVar8 = (aiQuatKey *)operator_new__(uVar13 * 0x18);
    if (uVar13 != 0) {
      paVar11 = paVar8;
      do {
        paVar11->mTime = 0.0;
        (paVar11->mValue).w = 1.0;
        (paVar11->mValue).x = 0.0;
        (paVar11->mValue).y = 0.0;
        (paVar11->mValue).z = 0.0;
        paVar11 = paVar11 + 1;
      } while (paVar11 != paVar8 + uVar13);
    }
    paVar14->mRotationKeys = paVar8;
    if (uVar12 == 0) {
      if (local_50 != (float *)0x0) goto LAB_0065f3b7;
    }
    else {
      pfVar9 = &(paVar8->mValue).z;
      lVar15 = 0;
      do {
        *(double *)(pfVar9 + -5) = (double)(*(float *)((long)local_50 + lVar15) * 1000.0);
        pfVar9[-2] = (&local_60->w)[lVar15];
        pfVar9[-1] = (&local_60->x)[lVar15];
        *pfVar9 = (&local_60->y)[lVar15];
        ((aiQuaternion *)(pfVar9 + -3))->w = (&local_60->z)[lVar15];
        lVar15 = lVar15 + 4;
        pfVar9 = pfVar9 + 6;
      } while (uVar13 << 2 != lVar15);
LAB_0065f3b7:
      operator_delete__(local_50);
    }
    if (local_60 != (aiQuaterniont<float> *)0x0) {
      operator_delete__(local_60);
    }
  }
  pSVar2 = samplers->scale;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->scale).isPresent != true) {
      return paVar14;
    }
    paVar14->mNumScalingKeys = 1;
    paVar7 = (aiVectorKey *)operator_new__(0x18);
    paVar14->mScalingKeys = paVar7;
    paVar7->mTime = 0.0;
    fVar3 = (node->scale).value[1];
    (paVar7->mValue).x = (node->scale).value[0];
    (paVar7->mValue).y = fVar3;
    (paVar7->mValue).z = (node->scale).value[2];
    return paVar14;
  }
  local_50 = (float *)0x0;
  glTF2::Accessor::ExtractData<float>
            ((((pSVar2->input).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(pSVar2->input).index],&local_50);
  local_60 = (aiQuaterniont<float> *)0x0;
  glTF2::Accessor::ExtractData<aiVector3t<float>>
            ((((samplers->scale->output).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(samplers->scale->output).index],
             (aiVector3t<float> **)&local_60);
  uVar13 = (((samplers->scale->input).vector)->
           super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(samplers->scale->input).index]->count;
  uVar12 = (uint)uVar13;
  uVar13 = uVar13 & 0xffffffff;
  paVar14->mNumScalingKeys = uVar12;
  paVar7 = (aiVectorKey *)operator_new__(uVar13 * 0x18);
  if (uVar13 != 0) {
    uVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&paVar7->mTime + uVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&(paVar7->mValue).z + uVar10) = 0;
      uVar10 = uVar10 + 0x18;
    } while (uVar13 * 0x18 != uVar10);
  }
  paVar6->mScalingKeys = paVar7;
  if (uVar12 == 0) {
    if (local_50 == (float *)0x0) goto LAB_0065f524;
  }
  else {
    lVar15 = 0;
    pfVar9 = local_50;
    do {
      *(double *)((long)&paVar7->mTime + lVar15 * 2) = (double)(*pfVar9 * 1000.0);
      *(undefined8 *)((long)&(paVar7->mValue).x + lVar15 * 2) =
           *(undefined8 *)((long)&local_60->w + lVar15);
      *(undefined4 *)((long)&(paVar7->mValue).z + lVar15 * 2) =
           *(undefined4 *)((long)&local_60->y + lVar15);
      pfVar9 = pfVar9 + 1;
      lVar15 = lVar15 + 0xc;
    } while (uVar13 * 0xc != lVar15);
  }
  operator_delete__(local_50);
LAB_0065f524:
  if (local_60 != (aiQuaterniont<float> *)0x0) {
    operator_delete__(local_60);
  }
  return paVar14;
}

Assistant:

aiNodeAnim* CreateNodeAnim(glTF2::Asset& r, Node& node, AnimationSamplers& samplers)
{
    aiNodeAnim* anim = new aiNodeAnim();
    anim->mNodeName = GetNodeName(node);

    static const float kMillisecondsFromSeconds = 1000.f;

    if (samplers.translation) {
        float* times = nullptr;
        samplers.translation->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.translation->output->ExtractData(values);
        anim->mNumPositionKeys = static_cast<uint32_t>(samplers.translation->input->count);
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        for (unsigned int i = 0; i < anim->mNumPositionKeys; ++i) {
            anim->mPositionKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mPositionKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.translation.isPresent) {
        anim->mNumPositionKeys = 1;
        anim->mPositionKeys = new aiVectorKey();
        anim->mPositionKeys->mTime = 0.f;
        anim->mPositionKeys->mValue.x = node.translation.value[0];
        anim->mPositionKeys->mValue.y = node.translation.value[1];
        anim->mPositionKeys->mValue.z = node.translation.value[2];
    }

    if (samplers.rotation) {
        float* times = nullptr;
        samplers.rotation->input->ExtractData(times);
        aiQuaternion* values = nullptr;
        samplers.rotation->output->ExtractData(values);
        anim->mNumRotationKeys = static_cast<uint32_t>(samplers.rotation->input->count);
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            anim->mRotationKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mRotationKeys[i].mValue.x = values[i].w;
            anim->mRotationKeys[i].mValue.y = values[i].x;
            anim->mRotationKeys[i].mValue.z = values[i].y;
            anim->mRotationKeys[i].mValue.w = values[i].z;
        }
        delete[] times;
        delete[] values;
    } else if (node.rotation.isPresent) {
        anim->mNumRotationKeys = 1;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        anim->mRotationKeys->mTime = 0.f;
        anim->mRotationKeys->mValue.x = node.rotation.value[0];
        anim->mRotationKeys->mValue.y = node.rotation.value[1];
        anim->mRotationKeys->mValue.z = node.rotation.value[2];
        anim->mRotationKeys->mValue.w = node.rotation.value[3];
    }

    if (samplers.scale) {
        float* times = nullptr;
        samplers.scale->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.scale->output->ExtractData(values);
        anim->mNumScalingKeys = static_cast<uint32_t>(samplers.scale->input->count);
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        for (unsigned int i = 0; i < anim->mNumScalingKeys; ++i) {
            anim->mScalingKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mScalingKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.scale.isPresent) {
        anim->mNumScalingKeys = 1;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        anim->mScalingKeys->mTime = 0.f;
        anim->mScalingKeys->mValue.x = node.scale.value[0];
        anim->mScalingKeys->mValue.y = node.scale.value[1];
        anim->mScalingKeys->mValue.z = node.scale.value[2];
    }

    return anim;
}